

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_a27195::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *format;
  _Alloc_hider __nptr;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char **ppcVar4;
  Arguments *pAVar5;
  iterator iVar6;
  int *piVar7;
  long lVar8;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  member;
  _Rb_tree_color compressType;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  cmTarCompression local_28c;
  allocator_type local_286;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_285;
  int local_284;
  int minCompressionLevel;
  undefined4 uStack_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_260 [32];
  pointer local_240;
  _Any_data _Stack_238;
  char *pcStack_228;
  _Any_data local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1c0;
  char *knownFormats [6];
  undefined8 local_168;
  cmTarCompression local_160 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  char *zipFileFormats [2];
  Arguments parsedArgs;
  
  if (((anonymous_namespace)::
       HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    parsedArgs.Format.field_2._M_allocated_capacity = 0;
    parsedArgs.Format.field_2._8_8_ = 0;
    parsedArgs.Format._M_dataplus._M_p = (pointer)0x0;
    parsedArgs.Format._M_string_length = 0;
    parsedArgs.Output.field_2._M_allocated_capacity = 0;
    parsedArgs.Output.field_2._8_8_ = 0;
    parsedArgs.Output._M_dataplus._M_p = (pointer)0x0;
    parsedArgs.Output._M_string_length = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = (_Base_ptr)0x0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
         0;
    name.super_string_view._M_str = "OUTPUT";
    name.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name,0x30);
    name_00.super_string_view._M_str = "FORMAT";
    name_00.super_string_view._M_len = 6;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_00,0x50);
    name_01.super_string_view._M_str = "COMPRESSION";
    name_01.super_string_view._M_len = 0xb;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_01,0x70);
    member = 0x90;
    name_02.super_string_view._M_str = "COMPRESSION_LEVEL";
    name_02.super_string_view._M_len = 0x11;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_02,0x90);
    name_03.super_string_view._M_str = "MTIME";
    name_03.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<ArgumentParser::Maybe<std::__cxx11::string>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_03,member);
    name_04.super_string_view._M_str = "VERBOSE";
    name_04.super_string_view._M_len = 7;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&parsedArgs,name_04,member);
    name_05.super_string_view._M_str = "PATHS";
    name_05.super_string_view._M_len = 5;
    cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&parsedArgs,name_05,member);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&HandleArchiveCreateCommand::parser,(ActionMap *)&parsedArgs);
    ArgumentParser::Base::~Base((Base *)&parsedArgs);
    __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveCreateCommand::parser,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_260._16_8_ = &unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  knownFormats[1] =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  knownFormats[0] =
       (char *)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Output._M_dataplus._M_p = (pointer)&parsedArgs.Output.field_2;
  parsedArgs.Output._M_string_length = 0;
  parsedArgs.Output.field_2._M_allocated_capacity =
       parsedArgs.Output.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Format._M_dataplus._M_p = (pointer)&parsedArgs.Format.field_2;
  parsedArgs.Format._M_string_length = 0;
  parsedArgs.Format.field_2._M_allocated_capacity =
       parsedArgs.Format.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Compression._M_dataplus._M_p = (pointer)&parsedArgs.Compression.field_2;
  parsedArgs.Compression._M_string_length = 0;
  parsedArgs.Compression.field_2._M_local_buf[0] = '\0';
  parsedArgs.CompressionLevel._M_dataplus._M_p = (pointer)&parsedArgs.CompressionLevel.field_2;
  parsedArgs.CompressionLevel._M_string_length = 0;
  parsedArgs.CompressionLevel.field_2._M_local_buf[0] = '\0';
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_dataplus._M_p =
       (pointer)&parsedArgs.MTime.
                 super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_string_length = 0;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2.
  _M_local_buf[0] = '\0';
  parsedArgs.Verbose = false;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_260._0_8_ = &HandleArchiveCreateCommand::parser;
  local_260._8_8_ = &parsedArgs;
  local_240 = (pointer)0x0;
  _Stack_238._M_unused._M_object = (char *)0x0;
  _Stack_238._8_8_ = 0;
  pcStack_228 = (char *)0x0;
  local_220._M_unused._M_object = (void *)0x0;
  local_220._8_8_ = 0;
  local_210.first._M_dataplus._M_p = (pointer)0x0;
  local_210.first._M_string_length = 0;
  local_210.first.field_2._M_local_buf[0] = false;
  local_260._24_8_ = local_260._8_8_;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)local_260,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)knownFormats,0);
  if ((_Manager_type)local_210.first._M_dataplus._M_p != (_Manager_type)0x0) {
    (*(code *)local_210.first._M_dataplus._M_p)(&local_220,&local_220,3);
  }
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar1) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar1 = true;
      goto LAB_002c2cc5;
    }
    format = &parsedArgs.Format;
    knownFormats[4] = "raw";
    knownFormats[5] = "zip";
    knownFormats[2] = "pax";
    knownFormats[3] = "paxr";
    knownFormats[0] = "7zip";
    knownFormats[1] = "gnutar";
    if ((parsedArgs.Format._M_string_length == 0) ||
       (ppcVar4 = std::
                  __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (knownFormats,&local_168,format), ppcVar4 != (char **)&local_168)) {
      zipFileFormats[0]._0_4_ = 0x86c561;
      zipFileFormats[0]._4_4_ = 0;
      zipFileFormats[1]._0_4_ = 0x86c562;
      zipFileFormats[1]._4_4_ = 0;
      if ((parsedArgs.Compression._M_string_length == 0) ||
         (pAVar5 = (Arguments *)
                   std::
                   __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (zipFileFormats,&parsedArgs,format), pAVar5 == &parsedArgs)) {
        if (((anonymous_namespace)::
             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::compressionTypeMap_abi_cxx11_ == '\0') &&
           (iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                         ::compressionTypeMap_abi_cxx11_), iVar3 != 0)) {
          minCompressionLevel = 4;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)local_260,(char (*) [5])0x83861d,(cmTarCompression *)&minCompressionLevel);
          local_28c = TarCompressBZip2;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                      *)&_Stack_238,(char (*) [6])"BZip2",&local_28c);
          local_160[1] = 0;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_210,(char (*) [5])"GZip",local_160 + 1);
          local_160[0] = TarCompressXZ;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                    (&local_1e8,(char (*) [3])"XZ",local_160);
          local_168._4_4_ = 3;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
          ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                    (&local_1c0,(char (*) [5])"Zstd",(cmTarCompression *)((long)&local_168 + 4));
          __l._M_len = 5;
          __l._M_array = (iterator)local_260;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
          ::map(&(anonymous_namespace)::
                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                 ::compressionTypeMap_abi_cxx11_,__l,&local_285,&local_286);
          lVar8 = -200;
          paVar9 = &local_1c0.first.field_2;
          do {
            if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar9->_M_allocated_capacity)[-2]) {
              operator_delete((long *)(&paVar9->_M_allocated_capacity)[-2],
                              paVar9->_M_allocated_capacity + 1);
            }
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(&paVar9->_M_allocated_capacity + -5);
            lVar8 = lVar8 + 0x28;
          } while (lVar8 != 0);
          __cxa_atexit(std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                       ::~map,&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&(anonymous_namespace)::
                               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                               ::compressionTypeMap_abi_cxx11_);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                ::find(&(anonymous_namespace)::
                        HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                        ::compressionTypeMap_abi_cxx11_._M_t,&parsedArgs.Compression);
        __nptr = parsedArgs.CompressionLevel._M_dataplus;
        if ((_Rb_tree_header *)iVar6._M_node ==
            &(anonymous_namespace)::
             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
             ::compressionTypeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          if (parsedArgs.Compression._M_string_length != 0) {
            local_260._0_8_ = &DAT_00000011;
            local_260._8_8_ = "compression type ";
            local_260._16_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_260._24_8_ = parsedArgs.Compression._M_string_length;
            local_240 = parsedArgs.Compression._M_dataplus._M_p;
            _Stack_238._M_unused._M_object = (char *)0x0;
            _Stack_238._8_8_ = 0x11;
            pcStack_228 = " is not supported";
            local_220._M_unused._M_object = (void *)0x0;
            views_02._M_len = 3;
            views_02._M_array = (iterator)local_260;
            cmCatViews((string *)&minCompressionLevel,views_02);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002c3048;
          }
          compressType = 4;
        }
        else {
          compressType = iVar6._M_node[2]._M_color;
        }
        local_28c = 9;
        if (compressType == 3) {
          local_28c = 0x13;
        }
        minCompressionLevel = 0;
        if (parsedArgs.CompressionLevel._M_string_length == 0) {
          lVar8 = 0;
LAB_002c3066:
          if (parsedArgs.Paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              parsedArgs.Paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_260._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_260 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_260,"ARCHIVE_CREATE requires a non-empty list of PATHS","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_270._M_allocated_capacity = local_260._16_8_;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_260._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_260 + 0x10)) goto LAB_002c2cb1;
            goto LAB_002c2cb9;
          }
          bVar2 = cmSystemTools::CreateTar
                            (&parsedArgs.Output,
                             &parsedArgs.Paths.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ,compressType,parsedArgs.Verbose,
                             &parsedArgs.MTime.
                              super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             ,format,(int)lVar8);
          bVar1 = true;
          if (bVar2) goto LAB_002c2cc5;
          cmStrCat<char_const(&)[21],std::__cxx11::string&>
                    ((string *)local_260,(char (*) [21])"failed to compress: ",&parsedArgs.Output);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else if ((parsedArgs.CompressionLevel._M_string_length == 1) ||
                ((int)*parsedArgs.CompressionLevel._M_dataplus._M_p - 0x30U < 10)) {
          piVar7 = __errno_location();
          local_284 = *piVar7;
          *piVar7 = 0;
          lVar8 = strtol(__nptr._M_p,(char **)local_260,10);
          if ((pointer)local_260._0_8_ == __nptr._M_p) {
            std::__throw_invalid_argument("stoi");
LAB_002c3486:
            std::__throw_out_of_range("stoi");
          }
          iVar3 = (int)lVar8;
          if ((iVar3 != lVar8) || (*piVar7 == 0x22)) goto LAB_002c3486;
          if (*piVar7 == 0) {
            *piVar7 = local_284;
          }
          if ((iVar3 < minCompressionLevel) || ((int)local_28c < iVar3)) {
            cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                      ((string *)local_260,(char (*) [19])"compression level ",
                       &parsedArgs.CompressionLevel,(char (*) [6])0x7e39c7,&parsedArgs.Compression,
                       (char (*) [21])" should be in range ",&minCompressionLevel,
                       (char (*) [5])0x80c149,(int *)&local_28c);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            if (compressType != 4) goto LAB_002c3066;
            cmStrCat<char_const(&)[58],std::__cxx11::string&>
                      ((string *)local_260,
                       (char (*) [58])"compression level is not supported for compression \"None\"",
                       &parsedArgs.Compression);
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
        }
        else {
          cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                    ((string *)local_260,(char (*) [19])"compression level ",
                     &parsedArgs.CompressionLevel,(char (*) [6])0x7e39c7,&parsedArgs.Compression,
                     (char (*) [21])" should be in range ",&minCompressionLevel,
                     (char (*) [5])0x80c149,(int *)&local_28c);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        local_270._M_allocated_capacity = local_260._16_8_;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_260._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_260 + 0x10)) goto LAB_002c2cb1;
        goto LAB_002c2cb9;
      }
      local_260._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
      local_260._8_8_ = "archive format ";
      local_260._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_260._24_8_ = parsedArgs.Format._M_string_length;
      local_240 = parsedArgs.Format._M_dataplus._M_p;
      _Stack_238._M_unused._M_object = (char *)0x0;
      _Stack_238._8_8_ = 0x27;
      pcStack_228 = " does not support COMPRESSION arguments";
      local_220._M_unused._M_object = (void *)0x0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)local_260;
      cmCatViews((string *)&minCompressionLevel,views_00);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      local_260._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0xf;
      local_260._8_8_ = "archive format ";
      local_260._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_260._24_8_ = parsedArgs.Format._M_string_length;
      local_240 = parsedArgs.Format._M_dataplus._M_p;
      _Stack_238._M_unused._M_object = (char *)0x0;
      _Stack_238._8_8_ = 0xe;
      pcStack_228 = " not supported";
      local_220._M_unused._M_object = (void *)0x0;
      views_01._M_len = 3;
      views_01._M_array = (iterator)local_260;
      cmCatViews((string *)&minCompressionLevel,views_01);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
LAB_002c3048:
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)CONCAT44(uStack_27c,minCompressionLevel);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_27c,minCompressionLevel) != &local_270) goto LAB_002c2cb1;
  }
  else {
    local_260._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x18;
    local_260._8_8_ = "Unrecognized argument: \"";
    local_260._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_240 = ((unrecognizedArguments.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    local_260._24_8_ =
         (unrecognizedArguments.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    _Stack_238._M_unused._M_object = (char *)0x0;
    _Stack_238._8_8_ = 1;
    pcStack_228 = "\"";
    local_220._M_unused._M_object = (void *)0x0;
    views._M_len = 3;
    views._M_array = (iterator)local_260;
    cmCatViews((string *)knownFormats,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_270._M_allocated_capacity = (size_type)knownFormats[2];
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)knownFormats[0];
    if ((char **)knownFormats[0] != knownFormats + 2) {
LAB_002c2cb1:
      operator_delete(paVar9,(ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_270._M_allocated_capacity)->_M_dataplus)->
                                            _M_impl).super__Vector_impl_data._M_start + 1));
    }
  }
LAB_002c2cb9:
  cmSystemTools::s_FatalErrorOccurred = true;
  bVar1 = false;
LAB_002c2cc5:
  HandleArchiveCreateCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar1;
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  int minCompressionLevel = 0;
  int maxCompressionLevel = 9;
  if (compress == cmSystemTools::TarCompressZstd) {
    maxCompressionLevel = 19;
  }

  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < minCompressionLevel ||
        compressionLevel > maxCompressionLevel) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}